

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O1

string * __thiscall
flatbuffers::BinaryAnnotator::BuildUnion_abi_cxx11_
          (string *__return_storage_ptr__,BinaryAnnotator *this,uint64_t union_offset,
          uint8_t realized_type,Field *field)

{
  long lVar1;
  string *psVar2;
  bool bVar3;
  ushort uVar4;
  Schema *pSVar5;
  Schema *pSVar6;
  Schema *pSVar7;
  long *plVar8;
  ushort uVar9;
  long lVar10;
  long *plVar11;
  size_type *psVar12;
  char *__function;
  uint uVar13;
  Field *pFVar14;
  unsigned_short vtsize_2;
  ushort uVar15;
  Schema *pSVar16;
  Object *table;
  long lVar17;
  long lVar18;
  unsigned_short vtsize_4;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  allocator<char> local_139;
  BinaryAnnotator *local_138;
  uint64_t local_130;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_128;
  string *local_110;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  string local_e8;
  long *local_c8 [2];
  long local_b8 [2];
  string local_a8;
  BinarySection local_88;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_48;
  
  pSVar16 = this->schema_;
  lVar18 = -(long)*(int *)pSVar16;
  uVar9 = *(ushort *)(pSVar16 + -(long)*(int *)pSVar16);
  if (uVar9 < 7) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(ushort *)(pSVar16 + lVar18 + 6);
  }
  if (uVar4 == 0) {
    pSVar5 = (Schema *)0x0;
  }
  else {
    pSVar5 = pSVar16 + (ulong)*(uint *)(pSVar16 + uVar4) + (ulong)uVar4;
  }
  lVar17 = -(long)*(int *)field;
  uVar4 = *(ushort *)(field + -(long)*(int *)field);
  if (uVar4 < 7) {
    uVar15 = 0;
  }
  else {
    uVar15 = *(ushort *)(field + lVar17 + 6);
  }
  if (uVar15 == 0) {
    pFVar14 = (Field *)0x0;
  }
  else {
    pFVar14 = field + (ulong)*(uint *)(field + uVar15) + (ulong)uVar15;
  }
  if (*(ushort *)(pFVar14 + -(long)*(int *)pFVar14) < 9) {
    uVar15 = 0;
  }
  else {
    uVar15 = *(ushort *)(pFVar14 + (8 - (long)*(int *)pFVar14));
  }
  if (uVar15 == 0) {
    uVar13 = 0xffffffff;
  }
  else {
    uVar13 = *(uint *)(pFVar14 + uVar15);
  }
  if (*(uint *)pSVar5 <= uVar13) {
    __function = 
    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Enum>, SizeT = unsigned int]"
    ;
LAB_00317ea5:
    __assert_fail("i < size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                  ,0xc1,__function);
  }
  lVar1 = (ulong)*(uint *)(pSVar5 + (ulong)(uVar13 << 2) + 4) + (ulong)(uVar13 << 2);
  pSVar6 = pSVar5 + lVar1 + 4;
  if (*(ushort *)(pSVar6 + -(long)*(int *)pSVar6) < 7) {
    uVar15 = 0;
  }
  else {
    uVar15 = *(ushort *)(pSVar5 + ((lVar1 + 10) - (long)*(int *)pSVar6));
  }
  if (uVar15 == 0) {
    pSVar6 = (Schema *)0x0;
  }
  else {
    pSVar6 = pSVar6 + (ulong)*(uint *)(pSVar6 + uVar15) + (ulong)uVar15;
  }
  local_110 = __return_storage_ptr__;
  if (*(uint *)pSVar6 <= (uint)realized_type) {
    __function = 
    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::EnumVal>, SizeT = unsigned int]"
    ;
    goto LAB_00317ea5;
  }
  lVar1 = (ulong)*(uint *)(pSVar6 + (ulong)realized_type * 4 + 4) + (ulong)realized_type * 4;
  pSVar5 = pSVar6 + lVar1 + 4;
  local_138 = this;
  local_130 = union_offset;
  bVar3 = ContainsSection(this,union_offset);
  lVar10 = -(long)*(int *)pSVar5;
  if (bVar3) {
    if (4 < *(ushort *)(pSVar5 + -(long)*(int *)pSVar5)) {
      uVar9 = *(ushort *)(pSVar6 + lVar10 + lVar1 + 8);
      goto LAB_00317e3c;
    }
  }
  else {
    if (*(ushort *)(pSVar5 + -(long)*(int *)pSVar5) < 0xb) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(ushort *)(pSVar6 + lVar10 + lVar1 + 0xe);
    }
    if (uVar15 == 0) {
      pSVar7 = (Schema *)0x0;
    }
    else {
      pSVar7 = pSVar5 + (ulong)*(uint *)(pSVar5 + uVar15) + (ulong)uVar15;
    }
    lVar10 = -(long)*(int *)pSVar7;
    if (*(ushort *)(pSVar7 + -(long)*(int *)pSVar7) < 5) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(ushort *)(pSVar7 + lVar10 + 4);
    }
    if ((uVar15 != 0) && (pSVar7[uVar15].super_Table == (Table)0xf)) {
      if (uVar9 < 5) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(ushort *)(pSVar16 + lVar18 + 4);
      }
      if (uVar9 == 0) {
        pSVar16 = (Schema *)0x0;
      }
      else {
        pSVar16 = pSVar16 + (ulong)*(uint *)(pSVar16 + uVar9) + (ulong)uVar9;
      }
      if (*(ushort *)(pSVar7 + -(long)*(int *)pSVar7) < 9) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(ushort *)(pSVar7 + lVar10 + 8);
      }
      if (uVar9 == 0) {
        uVar13 = 0xffffffff;
      }
      else {
        uVar13 = *(uint *)(pSVar7 + uVar9);
      }
      if (*(uint *)pSVar16 <= uVar13) {
        __function = 
        "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
        ;
        goto LAB_00317ea5;
      }
      lVar18 = (ulong)*(uint *)(pSVar16 + (ulong)(uVar13 << 2) + 4) + (ulong)(uVar13 << 2);
      table = (Object *)(pSVar16 + lVar18 + 4);
      if (*(ushort *)(table + -(long)*(int *)table) < 9) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(ushort *)(pSVar16 + ((lVar18 + 0xc) - (long)*(int *)table));
      }
      if ((uVar9 == 0) || (table[uVar9].super_Table == (Table)0x0)) {
        BuildTable(local_138,local_130,Table,table);
      }
      else {
        local_128.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (uVar4 < 5) {
          uVar9 = 0;
        }
        else {
          uVar9 = *(ushort *)(field + lVar17 + 4);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,
                   (char *)(field + (ulong)*(uint *)(field + uVar9) + (ulong)uVar9 + 4),
                   (allocator<char> *)&local_88);
        BuildStruct(local_138,local_130,&local_128,&local_a8,table);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (*(ushort *)(table + -(long)*(int *)table) < 5) {
          uVar9 = 0;
        }
        else {
          uVar9 = *(ushort *)(pSVar16 + ((lVar18 + 8) - (long)*(int *)table));
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_c8,
                   (char *)(table + (ulong)*(uint *)(table + uVar9) + (ulong)uVar9 + 4),&local_139);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_c8);
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_f8 = *plVar11;
          lStack_f0 = plVar8[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *plVar11;
          local_108 = (long *)*plVar8;
        }
        local_100 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
        psVar12 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_e8.field_2._M_allocated_capacity = *psVar12;
          local_e8.field_2._8_8_ = plVar8[3];
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar12;
          local_e8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_e8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        local_48.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_128.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_48.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_128.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_48.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_128.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_128.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        anon_unknown_49::MakeBinarySection(&local_88,&local_e8,Union,&local_48);
        AddSection(local_138,local_130,&local_88);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&local_88.regions);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.name._M_dataplus._M_p != &local_88.name.field_2) {
          operator_delete(local_88.name._M_dataplus._M_p,
                          local_88.name.field_2._M_allocated_capacity + 1);
        }
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if (local_108 != &local_f8) {
          operator_delete(local_108,local_f8 + 1);
        }
        if (local_c8[0] != local_b8) {
          operator_delete(local_c8[0],local_b8[0] + 1);
        }
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&local_128);
      }
    }
    if (4 < *(ushort *)(pSVar5 + -(long)*(int *)pSVar5)) {
      uVar9 = *(ushort *)(pSVar6 + ((lVar1 + 8) - (long)*(int *)pSVar5));
      goto LAB_00317e3c;
    }
  }
  uVar9 = 0;
LAB_00317e3c:
  psVar2 = local_110;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_110,
             (char *)(pSVar5 + (ulong)*(uint *)(pSVar5 + uVar9) + (ulong)uVar9 + 4),
             (allocator<char> *)&local_88);
  return psVar2;
}

Assistant:

std::string BinaryAnnotator::BuildUnion(const uint64_t union_offset,
                                        const uint8_t realized_type,
                                        const reflection::Field *const field) {
  const reflection::Enum *next_enum =
      schema_->enums()->Get(field->type()->index());

  const reflection::EnumVal *enum_val = next_enum->values()->Get(realized_type);

  if (ContainsSection(union_offset)) { return enum_val->name()->c_str(); }

  const reflection::Type *union_type = enum_val->union_type();

  if (union_type->base_type() == reflection::BaseType::Obj) {
    const reflection::Object *object =
        schema_->objects()->Get(union_type->index());

    if (object->is_struct()) {
      // Union of vectors point to a new Binary section
      std::vector<BinaryRegion> regions;

      BuildStruct(union_offset, regions, field->name()->c_str(), object);

      AddSection(
          union_offset,
          MakeBinarySection(std::string(object->name()->c_str()) + "." +
                                field->name()->c_str(),
                            BinarySectionType::Union, std::move(regions)));
    } else {
      BuildTable(union_offset, BinarySectionType::Table, object);
    }
  }
  // TODO(dbaileychess): handle the other union types.

  return enum_val->name()->c_str();
}